

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

CURLcode cf_hc_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  int *piVar1;
  Curl_cfilter *pCVar2;
  int *piVar3;
  int query_00;
  _Bool _Var4;
  CURLcode CVar5;
  ulong uVar6;
  curltime cVar7;
  
  if ((cf->field_0x24 & 1) == 0) {
    if (query == 4) {
      query_00 = 4;
    }
    else {
      if (query != 5) {
        if (query == 7) {
          piVar1 = (int *)cf->ctx;
          piVar3 = piVar1;
          for (uVar6 = 0; uVar6 < *(ulong *)(piVar1 + 0x26); uVar6 = uVar6 + 1) {
            if ((*(Curl_cfilter **)(piVar3 + 0xc) != (Curl_cfilter *)0x0) && (piVar3[0xe] == 0)) {
              _Var4 = Curl_conn_cf_needs_flush(*(Curl_cfilter **)(piVar3 + 0xc),data);
              if (_Var4) {
                *pres1 = 1;
                goto LAB_00114fc6;
              }
            }
            piVar3 = piVar3 + 0xe;
          }
        }
        goto LAB_00114f74;
      }
      query_00 = 5;
    }
    cVar7 = cf_get_max_baller_time(cf,data,query_00);
    *(time_t *)pres2 = cVar7.tv_sec;
    *(int *)((long)pres2 + 8) = cVar7.tv_usec;
LAB_00114fc6:
    CVar5 = CURLE_OK;
  }
  else {
LAB_00114f74:
    pCVar2 = cf->next;
    if (pCVar2 != (Curl_cfilter *)0x0) {
      CVar5 = (*pCVar2->cft->query)(pCVar2,data,query,pres1,pres2);
      return CVar5;
    }
    CVar5 = CURLE_UNKNOWN_OPTION;
  }
  return CVar5;
}

Assistant:

static CURLcode cf_hc_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  size_t i;

  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_NEED_FLUSH: {
      for(i = 0; i < ctx->baller_count; i++)
        if(cf_hc_baller_needs_flush(&ctx->ballers[i], data)) {
          *pres1 = TRUE;
          return CURLE_OK;
        }
      break;
    }
    default:
      break;
    }
  }
  return cf->next ?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}